

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.c
# Opt level: O3

double GetCostFixed(uint litlen,uint dist,void *unused)

{
  uint uVar1;
  int iVar2;
  
  if (dist != 0) {
    uVar1 = 0x1f;
    if (dist - 1 != 0) {
      for (; dist - 1 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    iVar2 = 0;
    if (4 < (int)dist) {
      iVar2 = (uVar1 ^ 0xffffffe0) + 0x1f;
    }
    return (double)(int)((0xd - (uint)(litlen < 0x73)) + iVar2 +
                        *(int *)(ZopfliGetLengthExtraBits_table + (long)(int)litlen * 4));
  }
  return *(double *)(&DAT_0010aea0 + (ulong)(litlen < 0x90) * 8);
}

Assistant:

static double GetCostFixed(unsigned litlen, unsigned dist, void* unused) {
  (void)unused;
  if (dist == 0) {
    if (litlen <= 143) return 8;
    else return 9;
  } else {
    int dbits = ZopfliGetDistExtraBits(dist);
    int lbits = ZopfliGetLengthExtraBits(litlen);
    int lsym = ZopfliGetLengthSymbol(litlen);
    int cost = 0;
    if (lsym <= 279) cost += 7;
    else cost += 8;
    cost += 5;  /* Every dist symbol has length 5. */
    return cost + dbits + lbits;
  }
}